

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O2

Timer _delete<long,phmap::parallel_flat_hash_map<long,long,phmap::Hash<long>,phmap::EqualTo<long>,std::allocator<std::pair<long_const,long>>,4ul,phmap::NullMutex>>
                (vector<long,_std::allocator<long>_> *v,
                parallel_flat_hash_map<long,_long,_phmap::Hash<long>,_phmap::EqualTo<long>,_std::allocator<std::pair<const_long,_long>_>,_4UL,_phmap::NullMutex>
                *hash)

{
  time_point tVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  
  _fill_random<long,phmap::parallel_flat_hash_map<long,long,phmap::Hash<long>,phmap::EqualTo<long>,std::allocator<std::pair<long_const,long>>,4ul,phmap::NullMutex>>
            (v,hash);
  _shuffle<long>(v);
  tVar1.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  lVar2 = (long)(v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
                ._M_finish -
          (long)(v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
                ._M_start >> 3;
  lVar3 = 0;
  while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
    phmap::priv::
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<long,_long>,_phmap::Hash<long>,_phmap::EqualTo<long>,_std::allocator<std::pair<const_long,_long>_>_>
    ::erase<long>((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<long,_long>,_phmap::Hash<long>,_phmap::EqualTo<long>,_std::allocator<std::pair<const_long,_long>_>_>
                   *)hash,(key_arg<long> *)
                          ((long)(v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                 super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + 8;
  }
  return (Timer)(rep)tVar1.__d.__r;
}

Assistant:

Timer _delete(vector<T> &v, HT &hash)
{
    _fill_random(v, hash);
    _shuffle(v); // don't delete in insertion order

    Timer timer(true);

    for(size_t i = 0, sz = v.size(); i < sz; ++i)
        hash.erase(v[i]);
    return timer;
}